

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O1

void j2k_add_tlmarker(int tileno,opj_codestream_info_t *cstr_info,unsigned_short type,int pos,
                     int len)

{
  int iVar1;
  opj_tile_info_t *poVar2;
  opj_marker_info_t *poVar3;
  
  poVar2 = cstr_info->tile;
  if (poVar2[tileno].maxmarknum <= poVar2[tileno].marknum) {
    poVar2[tileno].maxmarknum = (int)(float)poVar2[tileno].maxmarknum + 100;
    poVar3 = (opj_marker_info_t *)realloc(poVar2[tileno].marker,(long)cstr_info->maxmarknum);
    cstr_info->tile[tileno].marker = poVar3;
  }
  poVar2 = cstr_info->tile;
  poVar3 = poVar2[tileno].marker;
  iVar1 = poVar2[tileno].marknum;
  poVar3[iVar1].type = type;
  poVar3[iVar1].pos = (long)pos;
  poVar3[iVar1].len = len;
  poVar2[tileno].marknum = poVar2[tileno].marknum + 1;
  return;
}

Assistant:

static void j2k_add_tlmarker( int tileno, opj_codestream_info_t *cstr_info, unsigned short int type, int pos, int len)
{
	opj_marker_info_t *marker;

	assert(cstr_info != 00);

	/* expand the list? */
	if ((cstr_info->tile[tileno].marknum + 1) > cstr_info->tile[tileno].maxmarknum) {
		cstr_info->tile[tileno].maxmarknum = 100 + (int) ((float) cstr_info->tile[tileno].maxmarknum * 1.0F);
		cstr_info->tile[tileno].marker = (opj_marker_info_t*)opj_realloc(cstr_info->tile[tileno].marker, cstr_info->maxmarknum);
	}

	marker = &(cstr_info->tile[tileno].marker[cstr_info->tile[tileno].marknum]);

	/* add the marker */
	marker->type = type;
	marker->pos = pos;
	marker->len = len;
	cstr_info->tile[tileno].marknum++;
}